

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

Dec_Graph_t *
Rwt_CutEvaluateSeq(Ivy_Man_t *pMan,Rwt_Man_t *p,Ivy_Obj_t *pRoot,Ivy_Cut_t *pCut,char *pPerm,
                  Vec_Ptr_t *vFaninsCur,int nNodesSaved,int *pGainBest,uint uTruth)

{
  Dec_Graph_t *pGraph;
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  int local_6c;
  int local_68;
  int i;
  int GainBest;
  int nNodesAdded;
  Rwt_Node_t *pNode;
  Dec_Graph_t *pGraphCur;
  Dec_Graph_t *pGraphBest;
  Vec_Ptr_t *vSubgraphs;
  Vec_Ptr_t *vFaninsCur_local;
  char *pPerm_local;
  Ivy_Cut_t *pCut_local;
  Ivy_Obj_t *pRoot_local;
  Rwt_Man_t *p_local;
  Ivy_Man_t *pMan_local;
  
  pGraphCur = (Dec_Graph_t *)0x0;
  p_00 = Vec_VecEntry(p->vClasses,(uint)p->pMap[uTruth]);
  p->nSubgraphs = p_00->nSize + p->nSubgraphs;
  local_68 = -1;
  local_6c = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= local_6c) {
      if (local_68 == -1) {
        pMan_local = (Ivy_Man_t *)0x0;
      }
      else {
        *pGainBest = local_68;
        pMan_local = (Ivy_Man_t *)pGraphCur;
      }
      return (Dec_Graph_t *)pMan_local;
    }
    pvVar2 = Vec_PtrEntry(p_00,local_6c);
    pGraph = *(Dec_Graph_t **)((long)pvVar2 + 0x20);
    Ivy_GraphPrepare(pGraph,pCut,vFaninsCur,pPerm);
    iVar1 = Ivy_GraphToNetworkSeqCountSeq(pMan,pRoot,pGraph,nNodesSaved);
    if (iVar1 != -1) {
      if (nNodesSaved < iVar1) {
        __assert_fail("nNodesSaved >= nNodesAdded",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                      ,0x153,
                      "Dec_Graph_t *Rwt_CutEvaluateSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Ivy_Cut_t *, char *, Vec_Ptr_t *, int, int *, unsigned int)"
                     );
      }
      if (local_68 < nNodesSaved - iVar1) {
        local_68 = nNodesSaved - iVar1;
        pGraphCur = pGraph;
      }
    }
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Rwt_CutEvaluateSeq( Ivy_Man_t * pMan, Rwt_Man_t * p, Ivy_Obj_t * pRoot, Ivy_Cut_t * pCut, char * pPerm, Vec_Ptr_t * vFaninsCur, int nNodesSaved, int * pGainBest, unsigned uTruth )
{
    Vec_Ptr_t * vSubgraphs;
    Dec_Graph_t * pGraphBest = NULL; // Suppress "might be used uninitialized"
    Dec_Graph_t * pGraphCur;
    Rwt_Node_t * pNode;
    int nNodesAdded, GainBest, i;
    // find the matching class of subgraphs
    vSubgraphs = Vec_VecEntry( p->vClasses, p->pMap[uTruth] );
    p->nSubgraphs += vSubgraphs->nSize;
    // determine the best subgraph
    GainBest = -1;
    Vec_PtrForEachEntry( Rwt_Node_t *, vSubgraphs, pNode, i )
    {
        // get the current graph
        pGraphCur = (Dec_Graph_t *)pNode->pNext;

//        if ( pRoot->Id == 8648 )
//        Dec_GraphPrint( stdout, pGraphCur, NULL, NULL );
        // copy the leaves
//        Vec_PtrForEachEntry( Ivy_Obj_t *, vFaninsCur, pFanin, k )
//            Dec_GraphNode(pGraphCur, k)->pFunc = pFanin;
        Ivy_GraphPrepare( pGraphCur, pCut, vFaninsCur, pPerm );

        // detect how many unlabeled nodes will be reused
        nNodesAdded = Ivy_GraphToNetworkSeqCountSeq( pMan, pRoot, pGraphCur, nNodesSaved );
        if ( nNodesAdded == -1 )
            continue;
        assert( nNodesSaved >= nNodesAdded );
        // count the gain at this node
        if ( GainBest < nNodesSaved - nNodesAdded )
        {
            GainBest   = nNodesSaved - nNodesAdded;
            pGraphBest = pGraphCur;
        }
    }
    if ( GainBest == -1 )
        return NULL;
    *pGainBest = GainBest;
    return pGraphBest;
}